

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall cmGlobalUnixMakefileGenerator3::Configure(cmGlobalUnixMakefileGenerator3 *this)

{
  string local_30 [32];
  cmGlobalUnixMakefileGenerator3 *local_10;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  local_10 = this;
  (*(this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x1a])(local_30);
  std::__cxx11::string::~string(local_30);
  cmGlobalGenerator::Configure(&this->super_cmGlobalGenerator);
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::Configure()
{
  // Initialize CMAKE_EDIT_COMMAND cache entry.
  this->GetEditCacheCommand();

  this->cmGlobalGenerator::Configure();
}